

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

xmlNodePtr xmlStringGetNodeList(xmlDoc *doc,xmlChar *value)

{
  byte bVar1;
  xmlChar xVar2;
  int iVar3;
  xmlBufPtr buf;
  xmlEntityPtr pxVar4;
  xmlNodePtr pxVar5;
  xmlNodePtr pxVar6;
  xmlNodePtr elem;
  _xmlNode *p_Var7;
  xmlChar *pxVar8;
  xmlChar *pxVar9;
  long lVar10;
  xmlChar buffer [10];
  xmlNodePtr local_50;
  xmlChar local_3a [10];
  
  if (value == (xmlChar *)0x0) {
    pxVar5 = (xmlNodePtr)0x0;
  }
  else {
    pxVar5 = (xmlNodePtr)0x0;
    buf = xmlBufCreateSize(0);
    if (buf != (xmlBufPtr)0x0) {
      xmlBufSetAllocationScheme(buf,XML_BUFFER_ALLOC_HYBRID);
      local_50 = (xmlNodePtr)0x0;
      elem = (xmlNodePtr)0x0;
      do {
        do {
          while( true ) {
            pxVar9 = value + 2;
            pxVar8 = value;
            while( true ) {
              pxVar5 = elem;
              if (*pxVar8 == '\0') {
                if ((pxVar8 != value) || (elem == (xmlNodePtr)0x0)) {
                  xmlBufAdd(buf,value,(int)pxVar8 - (int)value);
                }
                iVar3 = xmlBufIsEmpty(buf);
                if (iVar3 == 0) {
                  pxVar6 = xmlNewText((xmlChar *)0x0);
                  pxVar5 = (xmlNodePtr)0x0;
                  if (pxVar6 != (xmlNodePtr)0x0) {
                    pxVar6->doc = doc;
                    pxVar9 = xmlBufDetach(buf);
                    pxVar6->content = pxVar9;
                    pxVar5 = pxVar6;
                    if (local_50 != (xmlNodePtr)0x0) {
                      xmlAddNextSibling(local_50,pxVar6);
                      pxVar5 = elem;
                    }
                  }
                }
                goto LAB_00187699;
              }
              if (*pxVar8 == '&') break;
              pxVar8 = pxVar8 + 1;
              pxVar9 = pxVar9 + 1;
            }
            if ((pxVar8 != value) &&
               (iVar3 = xmlBufAdd(buf,value,(int)pxVar8 - (int)value), iVar3 != 0))
            goto LAB_00187699;
            xVar2 = pxVar8[1];
            if (xVar2 == '#') break;
            lVar10 = 0;
            while( true ) {
              if (xVar2 == '\0') {
                __xmlSimpleError(2,0x516,(xmlNodePtr)doc,"unterminated entity reference %15s\n",
                                 (char *)(pxVar8 + 1));
                goto LAB_00187699;
              }
              if (xVar2 == ';') break;
              xVar2 = *pxVar9;
              pxVar9 = pxVar9 + 1;
              lVar10 = lVar10 + 1;
            }
            value = pxVar9;
            if (lVar10 != 0) {
              pxVar9 = xmlStrndup(pxVar8 + 1,(int)lVar10);
              pxVar4 = xmlGetDocEntity(doc,pxVar9);
              if ((pxVar4 == (xmlEntityPtr)0x0) || (pxVar4->etype != XML_INTERNAL_PREDEFINED_ENTITY)
                 ) {
                iVar3 = xmlBufIsEmpty(buf);
                pxVar6 = local_50;
                if (iVar3 == 0) {
                  pxVar5 = xmlNewText((xmlChar *)0x0);
                  if (pxVar5 != (xmlNodePtr)0x0) {
                    pxVar5->doc = doc;
                  }
                  pxVar8 = xmlBufDetach(buf);
                  pxVar5->content = pxVar8;
                  pxVar6 = pxVar5;
                  if (local_50 != (xmlNodePtr)0x0) {
                    pxVar6 = xmlAddNextSibling(local_50,pxVar5);
                    pxVar5 = elem;
                  }
                }
                local_50 = pxVar6;
                elem = xmlNewReference(doc,pxVar9);
                if (elem == (xmlNodePtr)0x0) {
                  if (pxVar9 != (xmlChar *)0x0) {
                    (*xmlFree)(pxVar9);
                  }
                  goto LAB_00187699;
                }
                if ((pxVar4 != (xmlEntityPtr)0x0) && (pxVar4->children == (_xmlNode *)0x0)) {
                  pxVar4->children = (_xmlNode *)0xffffffffffffffff;
                  pxVar6 = xmlStringGetNodeList(doc,elem->content);
                  pxVar4->children = pxVar6;
                  pxVar4->owner = 1;
                  if (pxVar6 != (xmlNodePtr)0x0) {
                    do {
                      p_Var7 = pxVar6;
                      p_Var7->parent = (_xmlNode *)pxVar4;
                      pxVar6 = p_Var7->next;
                    } while (p_Var7->next != (_xmlNode *)0x0);
                    pxVar4->last = p_Var7;
                  }
                }
                pxVar6 = elem;
                if (local_50 != (xmlNodePtr)0x0) {
                  pxVar6 = xmlAddNextSibling(local_50,elem);
                  elem = pxVar5;
                }
              }
              else {
                iVar3 = xmlBufCat(buf,pxVar4->content);
                pxVar6 = local_50;
                if (iVar3 != 0) goto LAB_00187699;
              }
              local_50 = pxVar6;
              (*xmlFree)(pxVar9);
            }
          }
          pxVar9 = pxVar8 + 2;
          bVar1 = pxVar8[2];
          lVar10 = 1;
          if (bVar1 == 0x3b) {
LAB_001874b0:
            iVar3 = 0;
LAB_001874b2:
            value = pxVar9 + lVar10;
          }
          else {
            if (bVar1 != 0x78) {
              iVar3 = 0;
              do {
                if (9 < (byte)(bVar1 - 0x30)) {
                  lVar10 = 0;
                  __xmlSimpleError(2,0x515,(xmlNodePtr)doc,"invalid decimal character value\n",
                                   (char *)0x0);
                  goto LAB_001874b0;
                }
                iVar3 = (uint)bVar1 + iVar3 * 10 + -0x30;
                bVar1 = pxVar9[1];
                pxVar9 = pxVar9 + 1;
              } while (bVar1 != 0x3b);
              goto LAB_001874b2;
            }
            bVar1 = pxVar8[3];
            pxVar8 = pxVar8 + 3;
            iVar3 = 0;
            if (bVar1 != 0x3b) {
              iVar3 = 0;
              do {
                if ((byte)(bVar1 - 0x30) < 10) {
                  iVar3 = iVar3 * 0x10 + (uint)bVar1 + -0x30;
                }
                else if ((byte)(bVar1 + 0x9f) < 6) {
                  iVar3 = iVar3 * 0x10 + (uint)bVar1 + -0x57;
                }
                else {
                  if (5 < (byte)(bVar1 + 0xbf)) {
                    lVar10 = 0;
                    __xmlSimpleError(2,0x514,(xmlNodePtr)doc,"invalid hexadecimal character value\n"
                                     ,(char *)0x0);
                    iVar3 = 0;
                    break;
                  }
                  iVar3 = iVar3 * 0x10 + (uint)bVar1 + -0x37;
                }
                bVar1 = pxVar8[1];
                pxVar8 = pxVar8 + 1;
              } while (bVar1 != 0x3b);
            }
            value = pxVar8 + lVar10;
          }
        } while (iVar3 == 0);
        iVar3 = xmlCopyCharMultiByte(local_3a,iVar3);
        local_3a[iVar3] = '\0';
        iVar3 = xmlBufCat(buf,local_3a);
      } while (iVar3 == 0);
LAB_00187699:
      xmlBufFree(buf);
    }
  }
  return pxVar5;
}

Assistant:

xmlNodePtr
xmlStringGetNodeList(const xmlDoc *doc, const xmlChar *value) {
    xmlNodePtr ret = NULL, last = NULL;
    xmlNodePtr node;
    xmlChar *val;
    const xmlChar *cur = value;
    const xmlChar *q;
    xmlEntityPtr ent;
    xmlBufPtr buf;

    if (value == NULL) return(NULL);

    buf = xmlBufCreateSize(0);
    if (buf == NULL) return(NULL);
    xmlBufSetAllocationScheme(buf, XML_BUFFER_ALLOC_HYBRID);

    q = cur;
    while (*cur != 0) {
	if (cur[0] == '&') {
	    int charval = 0;
	    xmlChar tmp;

	    /*
	     * Save the current text.
	     */
            if (cur != q) {
		if (xmlBufAdd(buf, q, cur - q))
		    goto out;
	    }
	    q = cur;
	    if ((cur[1] == '#') && (cur[2] == 'x')) {
		cur += 3;
		tmp = *cur;
		while (tmp != ';') { /* Non input consuming loop */
		    if ((tmp >= '0') && (tmp <= '9'))
			charval = charval * 16 + (tmp - '0');
		    else if ((tmp >= 'a') && (tmp <= 'f'))
			charval = charval * 16 + (tmp - 'a') + 10;
		    else if ((tmp >= 'A') && (tmp <= 'F'))
			charval = charval * 16 + (tmp - 'A') + 10;
		    else {
			xmlTreeErr(XML_TREE_INVALID_HEX, (xmlNodePtr) doc,
			           NULL);
			charval = 0;
			break;
		    }
		    cur++;
		    tmp = *cur;
		}
		if (tmp == ';')
		    cur++;
		q = cur;
	    } else if  (cur[1] == '#') {
		cur += 2;
		tmp = *cur;
		while (tmp != ';') { /* Non input consuming loops */
		    if ((tmp >= '0') && (tmp <= '9'))
			charval = charval * 10 + (tmp - '0');
		    else {
			xmlTreeErr(XML_TREE_INVALID_DEC, (xmlNodePtr) doc,
			           NULL);
			charval = 0;
			break;
		    }
		    cur++;
		    tmp = *cur;
		}
		if (tmp == ';')
		    cur++;
		q = cur;
	    } else {
		/*
		 * Read the entity string
		 */
		cur++;
		q = cur;
		while ((*cur != 0) && (*cur != ';')) cur++;
		if (*cur == 0) {
		    xmlTreeErr(XML_TREE_UNTERMINATED_ENTITY,
		               (xmlNodePtr) doc, (const char *) q);
		    goto out;
		}
		if (cur != q) {
		    /*
		     * Predefined entities don't generate nodes
		     */
		    val = xmlStrndup(q, cur - q);
		    ent = xmlGetDocEntity(doc, val);
		    if ((ent != NULL) &&
			(ent->etype == XML_INTERNAL_PREDEFINED_ENTITY)) {

			if (xmlBufCat(buf, ent->content))
			    goto out;

		    } else {
			/*
			 * Flush buffer so far
			 */
			if (!xmlBufIsEmpty(buf)) {
			    node = xmlNewDocText(doc, NULL);
			    node->content = xmlBufDetach(buf);

			    if (last == NULL) {
				last = ret = node;
			    } else {
				last = xmlAddNextSibling(last, node);
			    }
			}

			/*
			 * Create a new REFERENCE_REF node
			 */
			node = xmlNewReference(doc, val);
			if (node == NULL) {
			    if (val != NULL) xmlFree(val);
			    goto out;
			}
			else if ((ent != NULL) && (ent->children == NULL)) {
			    xmlNodePtr temp;

                            /* Set to non-NULL value to avoid recursion. */
			    ent->children = (xmlNodePtr) -1;
			    ent->children = xmlStringGetNodeList(doc,
				    (const xmlChar*)node->content);
			    ent->owner = 1;
			    temp = ent->children;
			    while (temp) {
				temp->parent = (xmlNodePtr)ent;
				ent->last = temp;
				temp = temp->next;
			    }
			}
			if (last == NULL) {
			    last = ret = node;
			} else {
			    last = xmlAddNextSibling(last, node);
			}
		    }
		    xmlFree(val);
		}
		cur++;
		q = cur;
	    }
	    if (charval != 0) {
		xmlChar buffer[10];
		int len;

		len = xmlCopyCharMultiByte(buffer, charval);
		buffer[len] = 0;

		if (xmlBufCat(buf, buffer))
		    goto out;
		charval = 0;
	    }
	} else
	    cur++;
    }
    if ((cur != q) || (ret == NULL)) {
        /*
	 * Handle the last piece of text.
	 */
	xmlBufAdd(buf, q, cur - q);
    }

    if (!xmlBufIsEmpty(buf)) {
	node = xmlNewDocText(doc, NULL);
        if (node == NULL) {
            xmlBufFree(buf);
            return(NULL);
        }
	node->content = xmlBufDetach(buf);

	if (last == NULL) {
	    ret = node;
	} else {
	    xmlAddNextSibling(last, node);
	}
    }

out:
    xmlBufFree(buf);
    return(ret);
}